

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpStructMatrix.cpp
# Opt level: O0

TPZStructMatrix * __thiscall
TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::Clone
          (TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  TPZStructMatrix *pTVar1;
  TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_> *in_RDI;
  TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  *unaff_retaddr;
  
  pTVar1 = (TPZStructMatrix *)operator_new(0xc0);
  TPZSpStructMatrix(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

TPZStructMatrix * TPZSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZSpStructMatrix(*this);
}